

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.h
# Opt level: O1

ostream * cppqc::
          printInput<std::vector<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::pair<unsigned_long,char>>,std::allocator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::pair<unsigned_long,char>>>>>
                    (ostream *out,
                    tuple<std::vector<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<unsigned_long,_char>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<unsigned_long,_char>_>_>_>_>
                    *in)

{
  ostream *poVar1;
  ostream *poVar2;
  char local_39;
  string local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  0: ",5);
  PrettyPrint<std::vector<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<unsigned_long,_char>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<unsigned_long,_char>_>_>_>_>
  ::toString(&local_38,
             (vector<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<unsigned_long,_char>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<unsigned_long,_char>_>_>_>
              *)in);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)out,local_38._M_dataplus._M_p,local_38._M_string_length);
  local_39 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_39,1);
  poVar2 = (ostream *)std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return poVar2;
}

Assistant:

std::ostream& printInput(std::ostream& out, const std::tuple<T0>& in) {
  return out << "  0: " << prettyPrint(std::get<0>(in)) << '\n' << std::flush;
}